

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

string * __thiscall
SchemePair::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemePair *this)

{
  element_type *peVar1;
  element_type *peVar2;
  bool bVar3;
  size_type sVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  char *__rhs;
  string *this_00;
  shared_ptr<SchemeSymbol> sVar6;
  initializer_list<const_SchemePair_*> __l;
  shared_ptr<SchemePair> pp;
  shared_ptr<SchemePair> pcdr;
  shared_ptr<SchemeSymbol> pcar;
  shared_ptr<SchemeObject> p;
  string res;
  set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  visited;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"()",(allocator *)&visited);
    return __return_storage_ptr__;
  }
  sVar6 = std::dynamic_pointer_cast<SchemeSymbol,SchemeObject>((shared_ptr<SchemeObject> *)&pcar);
  _Var5 = sVar6.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (pcar.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)&visited,"",(allocator *)&res);
    bVar3 = std::operator==(&(pcar.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->value,"quote");
    if ((((bVar3) ||
         (bVar3 = std::operator==(&(pcar.
                                    super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->value,"quasiquote"), bVar3)) ||
        (bVar3 = std::operator==(&(pcar.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->value,"unquote"), bVar3)) ||
       (bVar3 = std::operator==(&(pcar.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->value,"unquote-splicing"), bVar3)) {
      std::__cxx11::string::assign((char *)&visited);
    }
    if (visited._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
      std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&pcdr);
      if ((pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
           (element_type *)0x0) &&
         (((pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr).
          super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
        (*(((pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car).
           super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_SchemeObject
          [2])(&res);
        std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&visited
                       ,&res);
        std::__cxx11::string::~string((string *)&res);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        this_00 = (string *)&visited;
        goto LAB_00128140;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::__cxx11::string::~string((string *)&visited);
    _Var5._M_pi = extraout_RDX;
  }
  peVar1 = (this->car).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_SchemeObject[2])(&visited,peVar1,_Var5._M_pi);
  std::operator+(&res,"(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &visited);
  std::__cxx11::string::~string((string *)&visited);
  std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>,
             &(this->cdr).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
  pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&pcdr;
  pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  std::set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>::
  set(&visited,__l,(less<const_SchemePair_*> *)&local_70,(allocator_type *)&local_50);
  while( true ) {
    std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&pcdr);
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> *)&pcdr);
    peVar2 = pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (peVar2 == (element_type *)0x0) break;
    if (p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
      __rhs = ")";
LAB_0012810b:
      std::operator+(__return_storage_ptr__,&res,__rhs);
      goto LAB_0012811d;
    }
    (*(((pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->car).
       super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_SchemeObject[2])
              (&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcdr," ",
                   &local_70);
    std::__cxx11::string::append((string *)&res);
    std::__cxx11::string::~string((string *)&pcdr);
    std::__cxx11::string::~string((string *)&local_70);
    pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sVar4 = std::
            set<const_SchemePair_*,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
            ::count(&visited,(key_type *)&pcdr);
    if (sVar4 != 0) {
      __rhs = " ...)";
      goto LAB_0012810b;
    }
    std::__shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>,
               &((pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->cdr).
                super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>);
    pcdr.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::
    _Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
    ::_M_insert_unique<SchemePair_const*>
              ((_Rb_tree<SchemePair_const*,SchemePair_const*,std::_Identity<SchemePair_const*>,std::less<SchemePair_const*>,std::allocator<SchemePair_const*>>
                *)&visited,(SchemePair **)&pcdr);
  }
  std::operator+(&local_70,&res," . ");
  (*(p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_SchemeObject[2])
            (&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcdr,
                 &local_70,&local_50);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pcdr,")");
  std::__cxx11::string::~string((string *)&pcdr);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
LAB_0012811d:
  std::
  _Rb_tree<const_SchemePair_*,_const_SchemePair_*,_std::_Identity<const_SchemePair_*>,_std::less<const_SchemePair_*>,_std::allocator<const_SchemePair_*>_>
  ::~_Rb_tree(&visited._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pp.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&p.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this_00 = &res;
LAB_00128140:
  std::__cxx11::string::~string((string *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&pcar.super___shared_ptr<SchemeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string SchemePair::external_repr() const
{
    if(!car)
        return "()";
    auto pcar = std::dynamic_pointer_cast<SchemeSymbol>(car);
    if(pcar)
    {
        std::string prefix = "";
        if(pcar->value == "quote")
            prefix = "'";
        else if(pcar->value == "quasiquote")
            prefix = "`";
        else if(pcar->value == "unquote")
            prefix = ",";
        else if(pcar->value == "unquote-splicing")
            prefix = ",@";
        if(prefix.length())
        {
            auto pcdr = std::dynamic_pointer_cast<SchemePair>(cdr);
            if(pcdr && pcdr->cdr == scheme_nil)
                return prefix + pcdr->car->external_repr();
        }
    }
    std::string res = "(" + car->external_repr();
    std::shared_ptr<SchemeObject> p = cdr;
    std::shared_ptr<SchemePair> pp;
    std::set<const SchemePair *> visited{this};
    while((pp = std::dynamic_pointer_cast<SchemePair>(p)))
    {
        if(p == scheme_nil)
            return res + ")";
        res += " " + pp->car->external_repr();
        if(visited.count(pp.get()))
            return res + " ...)";
        p = pp->cdr;
        visited.insert(pp.get());
    }
    return res + " . " + p->external_repr() + ")";
}